

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerialQueue.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_e4a85::SerialQueueImpl::SerialQueueImpl(SerialQueueImpl *this)

{
  pointer __p_00;
  pointer __p;
  __uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_> local_20;
  
  (this->operationsThread)._M_t.
  super___uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_>._M_t.
  super__Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread>_>.
  super__Head_base<0UL,_std::thread_*,_false>._M_head_impl = (thread *)0x0;
  std::_Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::_Deque_base
            (&(this->operations).
              super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>);
  *(undefined8 *)((long)&(this->operationsMutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->operationsMutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->operationsMutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->operationsMutex).super___mutex_base._M_mutex + 8) = 0;
  (this->operationsMutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  std::condition_variable::condition_variable(&this->readyOperationsCondition);
  __p_00 = (pointer)operator_new(8);
  (__p_00->_M_id)._M_thread = 0;
  local_20._M_t.super__Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread>_>.
  super__Head_base<0UL,_std::thread_*,_false>._M_head_impl =
       (tuple<std::thread_*,_std::default_delete<std::thread>_>)operator_new(0x20);
  *(undefined ***)
   local_20._M_t.super__Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread>_>.
   super__Head_base<0UL,_std::thread_*,_false>._M_head_impl = &PTR___State_001c8160;
  *(SerialQueueImpl **)
   ((long)local_20._M_t.super__Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread>_>.
          super__Head_base<0UL,_std::thread_*,_false>._M_head_impl + 8) = this;
  *(code **)((long)local_20._M_t.
                   super__Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread>_>.
                   super__Head_base<0UL,_std::thread_*,_false>._M_head_impl + 0x10) = run;
  *(long *)((long)local_20._M_t.
                  super__Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread>_>.
                  super__Head_base<0UL,_std::thread_*,_false>._M_head_impl + 0x18) = 0;
  std::thread::_M_start_thread(__p_00,&local_20,0);
  if ((_Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread>_>)
      local_20._M_t.super__Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread>_>.
      super__Head_base<0UL,_std::thread_*,_false>._M_head_impl != (thread *)0x0) {
    (**(code **)(*(long *)local_20._M_t.
                          super__Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread>_>.
                          super__Head_base<0UL,_std::thread_*,_false>._M_head_impl + 8))();
  }
  local_20._M_t.super__Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread>_>.
  super__Head_base<0UL,_std::thread_*,_false>._M_head_impl =
       (tuple<std::thread_*,_std::default_delete<std::thread>_>)
       (_Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread>_>)0x0;
  std::__uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_>::reset
            ((__uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_> *)this,__p_00);
  std::unique_ptr<std::thread,_std::default_delete<std::thread>_>::~unique_ptr
            ((unique_ptr<std::thread,_std::default_delete<std::thread>_> *)&local_20);
  return;
}

Assistant:

SerialQueueImpl() {
    // Ensure the queue is fully initialized before creating the worker thread.
    operationsThread = llvm::make_unique<std::thread>(
        &SerialQueueImpl::run, this);
  }